

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O0

uint8_t * DecodeIntoRGBABuffer
                    (WEBP_CSP_MODE colorspace,uint8_t *data,size_t data_size,uint8_t *rgba,
                    int stride,size_t size)

{
  int iVar1;
  VP8StatusCode VVar2;
  WebPDecParams *in_RCX;
  size_t in_RDX;
  uint8_t *in_RSI;
  undefined4 in_R8D;
  undefined8 in_R9;
  WebPDecBuffer buf;
  WebPDecParams params;
  undefined1 local_120 [12];
  undefined4 local_114;
  undefined4 local_108;
  undefined8 local_100;
  undefined1 *local_a8;
  undefined8 local_38;
  undefined4 local_2c;
  WebPDecParams *local_8;
  
  if ((in_RCX == (WebPDecParams *)0x0) ||
     (local_38 = in_R9, local_2c = in_R8D, iVar1 = WebPInitDecBuffer((WebPDecBuffer *)0x1125db),
     iVar1 == 0)) {
    local_8 = (WebPDecParams *)0x0;
  }
  else {
    WebPResetDecParams((WebPDecParams *)0x1125fe);
    local_a8 = local_120;
    local_108 = local_2c;
    local_100 = local_38;
    local_114 = 1;
    VVar2 = DecodeInto(in_RSI,in_RDX,in_RCX);
    local_8 = in_RCX;
    if (VVar2 != VP8_STATUS_OK) {
      local_8 = (WebPDecParams *)0x0;
    }
  }
  return (uint8_t *)local_8;
}

Assistant:

WEBP_NODISCARD static uint8_t* DecodeIntoRGBABuffer(WEBP_CSP_MODE colorspace,
                                                    const uint8_t* const data,
                                                    size_t data_size,
                                                    uint8_t* const rgba,
                                                    int stride, size_t size) {
  WebPDecParams params;
  WebPDecBuffer buf;
  if (rgba == NULL || !WebPInitDecBuffer(&buf)) {
    return NULL;
  }
  WebPResetDecParams(&params);
  params.output = &buf;
  buf.colorspace    = colorspace;
  buf.u.RGBA.rgba   = rgba;
  buf.u.RGBA.stride = stride;
  buf.u.RGBA.size   = size;
  buf.is_external_memory = 1;
  if (DecodeInto(data, data_size, &params) != VP8_STATUS_OK) {
    return NULL;
  }
  return rgba;
}